

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O0

Book * __thiscall
Library::checkout_book(Book *__return_storage_ptr__,Library *this,Patron *patron,Book *book)

{
  bool bVar1;
  reference pPVar2;
  pointer pPVar3;
  pointer pBVar4;
  reference pBVar5;
  double __val;
  value_type local_470;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  stringstream local_260 [8];
  stringstream ss;
  ostream local_250 [376];
  __normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_> local_d8;
  Book *local_d0;
  __normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_> local_c8;
  __normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_> local_c0;
  __normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_> found_book;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_> local_48;
  Patron *local_40;
  __normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_> local_38;
  __normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_> local_30;
  __normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_> found_patron;
  Book *book_local;
  Patron *patron_local;
  Library *this_local;
  
  found_patron._M_current = (Patron *)book;
  local_38._M_current =
       (Patron *)std::vector<Patron,_std::allocator<Patron>_>::begin(&this->patrons);
  local_40 = (Patron *)std::vector<Patron,_std::allocator<Patron>_>::end(&this->patrons);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<Patron*,std::vector<Patron,std::allocator<Patron>>>,Patron>
                       (local_38,(__normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_>
                                  )local_40,patron);
  local_48._M_current = (Patron *)std::vector<Patron,_std::allocator<Patron>_>::end(&this->patrons);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_48);
  if (bVar1) {
    Patron::get_name_abi_cxx11_(&local_a8,patron);
    std::operator+(&local_88,"Error in Library::checkout_book() - Patron with name \'",&local_a8);
    std::operator+(&local_68,&local_88,"\' is not registered.");
    error(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  local_c8._M_current = (Book *)std::vector<Book,_std::allocator<Book>_>::begin(&this->books);
  local_d0 = (Book *)std::vector<Book,_std::allocator<Book>_>::end(&this->books);
  local_c0 = std::
             find<__gnu_cxx::__normal_iterator<Book*,std::vector<Book,std::allocator<Book>>>,Book>
                       (local_c8,(__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>
                                  )local_d0,(Book *)found_patron._M_current);
  local_d8._M_current = (Book *)std::vector<Book,_std::allocator<Book>_>::end(&this->books);
  bVar1 = __gnu_cxx::operator==(&local_c0,&local_d8);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_260);
    operator<<(local_250,(Book *)found_patron._M_current);
    Book::get_isbn_abi_cxx11_(&local_2c0,(Book *)found_patron._M_current);
    std::operator+(&local_2a0,"Error in Library::checkout_book() - Book with ISBN=",&local_2c0);
    std::operator+(&local_280,&local_2a0," not found.");
    error(&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::stringstream::~stringstream(local_260);
  }
  pPVar2 = __gnu_cxx::__normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_>::
           operator*(&local_30);
  bVar1 = owes_fees(pPVar2);
  if (bVar1) {
    pPVar3 = __gnu_cxx::__normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_>::
             operator->(&local_30);
    Patron::get_name_abi_cxx11_(&local_360,pPVar3);
    std::operator+(&local_340,"Error in Library::checkout_book() - ",&local_360);
    std::operator+(&local_320,&local_340," owes fee: ");
    pPVar3 = __gnu_cxx::__normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_>::
             operator->(&local_30);
    __val = Patron::get_fees(pPVar3);
    std::__cxx11::to_string(&local_380,__val);
    std::operator+(&local_300,&local_320,&local_380);
    std::operator+(&local_2e0,&local_300,"$.");
    error(&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
  }
  pBVar4 = __gnu_cxx::__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>::
           operator->(&local_c0);
  bVar1 = Book::is_checked_out(pBVar4);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,
               "Error in Library::checkout_book() - Requested book is already checked out.",
               &local_3a1);
    error(&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
  }
  pBVar4 = __gnu_cxx::__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>::
           operator->(&local_c0);
  Book::check_out(pBVar4);
  pBVar5 = __gnu_cxx::__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>::
           operator*(&local_c0);
  Book::Book(&local_470.book,pBVar5);
  pPVar2 = __gnu_cxx::__normal_iterator<Patron_*,_std::vector<Patron,_std::allocator<Patron>_>_>::
           operator*(&local_30);
  Patron::Patron(&local_470.patron,pPVar2);
  Date::Date(&local_470.date);
  std::vector<Transaction,_std::allocator<Transaction>_>::push_back(&this->transactions,&local_470);
  Transaction::~Transaction(&local_470);
  pBVar5 = __gnu_cxx::__normal_iterator<Book_*,_std::vector<Book,_std::allocator<Book>_>_>::
           operator*(&local_c0);
  Book::Book(__return_storage_ptr__,pBVar5);
  return __return_storage_ptr__;
}

Assistant:

Book Library::checkout_book(const Patron& patron, const Book& book)
{
	auto found_patron = std::find(
		patrons.begin(), patrons.end(), patron
	);
	if (found_patron == patrons.end())
		error("Error in Library::checkout_book() - Patron with name '"
			+ patron.get_name() 
			+ "' is not registered.");
	auto found_book = std::find(
		books.begin(), books.end(), book
	);
	if (found_book == books.end())
	{
		std::stringstream ss;
		ss << book;
		error("Error in Library::checkout_book() - Book with ISBN="
			+ book.get_isbn() + " not found.");
	}
	if (owes_fees(*found_patron))
		error("Error in Library::checkout_book() - "
			+ found_patron->get_name()
			+ " owes fee: "
			+ std::to_string(found_patron->get_fees())
			+ "$.");
	if (found_book->is_checked_out())
		error("Error in Library::checkout_book() - Requested book is already checked out.");
	found_book->check_out();
	transactions.push_back(Transaction{ *found_book, *found_patron, Date{} });
	return *found_book;
}